

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processCommandsForCore(CommonCore *this,ActionMessage *cmd)

{
  action_t aVar1;
  GlobalFederateId federateID;
  BaseTimeCoordinator *pBVar2;
  pointer pcVar3;
  size_type sVar4;
  string_view message;
  string_view message_00;
  json_value jVar5;
  bool bVar6;
  FederateStates FVar7;
  int iVar8;
  ActionMessage *extraout_RDX;
  ActionMessage *command;
  string_view name;
  string_view name_00;
  iterator local_1d0;
  iterator local_1b8;
  ActionMessage bye;
  json json;
  
  bVar6 = isTimingCommand(cmd);
  if (bVar6) {
    pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    bVar6 = (this->super_BrokerBase).enteredExecutionMode;
    iVar8 = (*pBVar2->_vptr_BaseTimeCoordinator[3])(pBVar2,cmd);
    if (bVar6 == false) {
      pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      iVar8 = (*pBVar2->_vptr_BaseTimeCoordinator[9])(pBVar2,0x8831d580);
      if ((char)iVar8 == '\0') {
        (this->super_BrokerBase).enteredExecutionMode = true;
      }
    }
    else if ((char)iVar8 != '\0') {
      (*((this->super_BrokerBase).timeCoord._M_t.
         super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
         ._M_t.
         super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
         .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
        _vptr_BaseTimeCoordinator[2])();
    }
    bVar6 = isDisconnectCommand(cmd);
    if (bVar6) {
      if ((cmd->messageAction != cmd_disconnect) ||
         ((cmd->source_id).gid != (this->super_BrokerBase).higher_broker_id.gid)) {
        checkAndProcessDisconnect(this);
        return;
      }
      BrokerBase::setBrokerState(&this->super_BrokerBase,TERMINATING);
      if (((this->super_BrokerBase).hasTimeDependency != false) ||
         ((this->super_BrokerBase).hasFilters == true)) {
        BaseTimeCoordinator::disconnect
                  ((this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      }
      ActionMessage::ActionMessage(&bye,cmd_disconnect_fed_ack);
      bye.source_id.gid = 0;
      gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
      begin(&local_1b8,&(this->loopFederates).dataStorage);
      gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
      end(&local_1d0,&(this->loopFederates).dataStorage);
      json.m_data._0_8_ = local_1b8.vec;
      json.m_data.m_value = (json_value)local_1b8.ptr;
      while ((jVar5 = json.m_data.m_value, local_1b8.offset != local_1d0.offset ||
             ((FedInfo **)json.m_data._0_8_ != local_1d0.vec))) {
        FVar7 = FederateState::getState
                          ((FederateState *)
                           ((json.m_data.m_value.array)->
                           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
        if ((FVar7 & ~INITIALIZING) != ERRORED) {
          bye.dest_id.gid =
               *(BaseType *)
                ((long)&((jVar5.array)->
                        super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[2].m_data.m_value + 4);
          FederateState::addAction
                    ((FederateState *)
                     ((jVar5.array)->
                     super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&bye);
        }
        gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator++
                  ((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)&json);
      }
      ActionMessage::ActionMessage((ActionMessage *)&json,cmd_stop);
      BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)&json);
      ActionMessage::~ActionMessage((ActionMessage *)&json);
      ActionMessage::~ActionMessage(&bye);
    }
  }
  else {
    aVar1 = cmd->messageAction;
    command = extraout_RDX;
    if (((uint)(aVar1 + ~(cmd_remove_publication|cmd_disconnect)) < 10) &&
       (command = (ActionMessage *)0x333,
       (0x333U >> (aVar1 + ~(cmd_remove_publication|cmd_disconnect) & 0x1fU) & 1) != 0)) {
      BaseTimeCoordinator::processDependencyUpdateMessage
                ((this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,cmd);
      return;
    }
    if ((uint)(aVar1 + ~(cmd_request_current_time|cmd_tick)) < 2) {
      manageTimeBlocks(this,cmd);
      return;
    }
    if (aVar1 == cmd_grant_timeout_check) {
      BaseTimeCoordinator::grantTimeoutCheck_abi_cxx11_
                ((BaseTimeCoordinator *)&json,
                 (ActionMessage *)
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      if (json.m_data.m_type != null) {
        fileops::generateJsonString((string *)&bye,&json,true);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bye,0,
                   "TIME DEBUGGING::");
        message._M_len._4_4_ = bye.source_handle.hid;
        message._M_len._0_4_ = bye.source_id.gid;
        message._M_str = (char *)bye._0_8_;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name,
                   message,false);
        std::__cxx11::string::~string((string *)&bye);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&json.m_data);
    }
    else {
      federateID.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      pcVar3 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar4 = (this->super_BrokerBase).identifier._M_string_length;
      prettyPrintString_abi_cxx11_((string *)&json,(helics *)cmd,command);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bye,
                     "dropping message:",(string *)&json);
      message_00._M_len._4_4_ = bye.source_handle.hid;
      message_00._M_len._0_4_ = bye.source_id.gid;
      message_00._M_str = (char *)bye._0_8_;
      name_00._M_str = pcVar3;
      name_00._M_len = sVar4;
      BrokerBase::sendToLogger(&this->super_BrokerBase,federateID,3,name_00,message_00,false);
      std::__cxx11::string::~string((string *)&bye);
      std::__cxx11::string::~string((string *)&json);
    }
  }
  return;
}

Assistant:

void CommonCore::processCommandsForCore(const ActionMessage& cmd)
{
    if (isTimingCommand(cmd)) {
        if (!enteredExecutionMode) {
            timeCoord->processTimeMessage(cmd);
            auto res = timeCoord->checkExecEntry();
            if (res == MessageProcessingResult::NEXT_STEP) {
                enteredExecutionMode = true;
            }
        } else {
            if (timeCoord->processTimeMessage(cmd) != TimeProcessingResult::NOT_PROCESSED) {
                timeCoord->updateTimeFactors();
            }
        }
        if (isDisconnectCommand(cmd)) {
            if ((cmd.action() == CMD_DISCONNECT) && (cmd.source_id == higher_broker_id)) {
                setBrokerState(BrokerState::TERMINATING);
                if (hasTimeDependency || hasFilters) {
                    timeCoord->disconnect();
                }
                ActionMessage bye(CMD_DISCONNECT_FED_ACK);
                bye.source_id = parent_broker_id;
                loopFederates.apply([&bye](auto& fed) {
                    auto state = fed->getState();
                    if ((FederateStates::FINISHED == state) || (FederateStates::ERRORED == state)) {
                        return;
                    }
                    bye.dest_id = fed->global_id.load();
                    fed->addAction(bye);
                });

                addActionMessage(CMD_STOP);
            } else {
                checkAndProcessDisconnect();
            }
        }
    } else if (isDependencyCommand(cmd)) {
        timeCoord->processDependencyUpdateMessage(cmd);
    } else if (cmd.action() == CMD_TIME_BLOCK || cmd.action() == CMD_TIME_UNBLOCK) {
        manageTimeBlocks(cmd);
    } else if (cmd.action() == CMD_GRANT_TIMEOUT_CHECK) {
        auto json = timeCoord->grantTimeoutCheck(cmd);
        if (!json.is_null()) {
            auto debugString = fileops::generateJsonString(json);
            debugString.insert(0, "TIME DEBUGGING::");
            LOG_WARNING(global_broker_id_local, getIdentifier(), debugString);
        }
    } else {
        LOG_WARNING(global_broker_id_local,
                    getIdentifier(),
                    "dropping message:" + prettyPrintString(cmd));
    }
}